

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O0

void UI::PathTracerStartButton(shared_ptr<PathTracerThread> *path_tracer_thread,char **open_modal)

{
  bool bVar1;
  char *in_RSI;
  bool in_stack_000000ae;
  bool in_stack_000000af;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae);
  if (bVar1) {
    *(char **)in_RSI = "Start PathTracer";
  }
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_RSI);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted(in_RSI,in_stack_ffffffffffffffe8);
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

void PathTracerStartButton(const std::shared_ptr<PathTracerThread> &path_tracer_thread, const char **open_modal) {
	if (ImGui::MenuItem(ICON_FA_PLAY)) {
		*open_modal = kPathTracerStartModal;
	}
	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Start Path Tracer");
		ImGui::EndTooltip();
	}
}